

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

TypedExpectation<void_(SDL_Renderer_*)> * __thiscall
testing::internal::FunctionMocker<void_(SDL_Renderer_*)>::AddNewExpectation
          (FunctionMocker<void_(SDL_Renderer_*)> *this,char *file,int line,string *source_text,
          ArgumentMatcherTuple *m)

{
  Sequence *this_00;
  void *mock_obj;
  TypedExpectation<void_(SDL_Renderer_*)> *this_01;
  Sequence **ppSVar1;
  shared_ptr<testing::internal::ExpectationBase> untyped_expectation;
  value_type local_50;
  Expectation local_40;
  
  mock_obj = UntypedFunctionMockerBase::MockObject(&this->super_UntypedFunctionMockerBase);
  Mock::RegisterUseByOnCallOrExpectCall(mock_obj,file,line);
  this_01 = (TypedExpectation<void_(SDL_Renderer_*)> *)operator_new(0x140);
  TypedExpectation<void_(SDL_Renderer_*)>::TypedExpectation(this_01,this,file,line,source_text,m);
  local_50.super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::internal::TypedExpectation<void(SDL_Renderer*)>*>
            (&local_50.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_01);
  std::
  vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ::push_back(&(this->super_UntypedFunctionMockerBase).untyped_expectations_,&local_50);
  ppSVar1 = ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                      ((ThreadLocal<testing::Sequence_*> *)g_gmock_implicit_sequence);
  this_00 = *ppSVar1;
  if (this_00 != (Sequence *)0x0) {
    Expectation::Expectation(&local_40,&local_50);
    Sequence::AddExpectation(this_00,&local_40);
    Expectation::~Expectation(&local_40);
  }
  if (local_50.super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return this_01;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    Mock::RegisterUseByOnCallOrExpectCall(MockObject(), file, line);
    TypedExpectation<F>* const expectation =
        new TypedExpectation<F>(this, file, line, source_text, m);
    const std::shared_ptr<ExpectationBase> untyped_expectation(expectation);
    // See the definition of untyped_expectations_ for why access to
    // it is unprotected here.
    untyped_expectations_.push_back(untyped_expectation);

    // Adds this expectation into the implicit sequence if there is one.
    Sequence* const implicit_sequence = g_gmock_implicit_sequence.get();
    if (implicit_sequence != nullptr) {
      implicit_sequence->AddExpectation(Expectation(untyped_expectation));
    }

    return *expectation;
  }